

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_subpubkey(uchar **p,uchar *end,mbedtls_pk_context *pk)

{
  int iVar1;
  uchar *end_00;
  mbedtls_pk_info_t *info;
  mbedtls_rsa_context *rsa;
  mbedtls_ecp_keypair *pmVar2;
  mbedtls_pk_info_t *pk_info;
  undefined1 local_50 [4];
  mbedtls_pk_type_t pk_alg;
  mbedtls_asn1_buf alg_params;
  size_t len;
  int ret;
  mbedtls_pk_context *pk_local;
  uchar *end_local;
  uchar **p_local;
  
  pk_info._4_4_ = MBEDTLS_PK_NONE;
  iVar1 = mbedtls_asn1_get_tag(p,end,(size_t *)&alg_params.p,0x30);
  if (iVar1 == 0) {
    end_00 = *p + (long)alg_params.p;
    p_local._4_4_ =
         pk_get_pk_alg(p,end_00,(mbedtls_pk_type_t *)((long)&pk_info + 4),
                       (mbedtls_asn1_buf *)local_50);
    if (p_local._4_4_ == 0) {
      iVar1 = mbedtls_asn1_get_bitstring_null(p,end_00,(size_t *)&alg_params.p);
      if (iVar1 == 0) {
        if (*p + (long)alg_params.p == end_00) {
          info = mbedtls_pk_info_from_type(pk_info._4_4_);
          if (info == (mbedtls_pk_info_t *)0x0) {
            p_local._4_4_ = -0x3c80;
          }
          else {
            p_local._4_4_ = mbedtls_pk_setup(pk,info);
            if (p_local._4_4_ == 0) {
              if (pk_info._4_4_ == MBEDTLS_PK_RSA) {
                rsa = mbedtls_pk_rsa(*pk);
                len._4_4_ = pk_get_rsapubkey(p,end_00,rsa);
              }
              else if ((pk_info._4_4_ == MBEDTLS_PK_ECKEY_DH) || (pk_info._4_4_ == MBEDTLS_PK_ECKEY)
                      ) {
                pmVar2 = mbedtls_pk_ec(*pk);
                len._4_4_ = pk_use_ecparams((mbedtls_asn1_buf *)local_50,&pmVar2->grp);
                if (len._4_4_ == 0) {
                  pmVar2 = mbedtls_pk_ec(*pk);
                  len._4_4_ = pk_get_ecpubkey(p,end_00,pmVar2);
                }
              }
              else {
                len._4_4_ = -0x3c80;
              }
              if ((len._4_4_ == 0) && (*p != end_00)) {
                len._4_4_ = -0x3b66;
              }
              if (len._4_4_ != 0) {
                mbedtls_pk_free(pk);
              }
              p_local._4_4_ = len._4_4_;
            }
          }
        }
        else {
          p_local._4_4_ = -0x3b66;
        }
      }
      else {
        p_local._4_4_ = iVar1 + -0x3b00;
      }
    }
  }
  else {
    p_local._4_4_ = iVar1 + -0x3d00;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_pk_parse_subpubkey( unsigned char **p, const unsigned char *end,
                        mbedtls_pk_context *pk )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    mbedtls_asn1_buf alg_params;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    const mbedtls_pk_info_t *pk_info;

    PK_VALIDATE_RET( p != NULL );
    PK_VALIDATE_RET( *p != NULL );
    PK_VALIDATE_RET( end != NULL );
    PK_VALIDATE_RET( pk != NULL );

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = *p + len;

    if( ( ret = pk_get_pk_alg( p, end, &pk_alg, &alg_params ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_asn1_get_bitstring_null( p, end, &len ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    if( ( pk_info = mbedtls_pk_info_from_type( pk_alg ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( pk, pk_info ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA )
    {
        ret = pk_get_rsapubkey( p, end, mbedtls_pk_rsa( *pk ) );
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( pk_alg == MBEDTLS_PK_ECKEY_DH || pk_alg == MBEDTLS_PK_ECKEY )
    {
        ret = pk_use_ecparams( &alg_params, &mbedtls_pk_ec( *pk )->grp );
        if( ret == 0 )
            ret = pk_get_ecpubkey( p, end, mbedtls_pk_ec( *pk ) );
    } else
#endif /* MBEDTLS_ECP_C */
        ret = MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    if( ret == 0 && *p != end )
        ret = MBEDTLS_ERR_PK_INVALID_PUBKEY
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;

    if( ret != 0 )
        mbedtls_pk_free( pk );

    return( ret );
}